

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O0

void Rsb_ManPerformResub6Test(void)

{
  word local_80;
  word uTruth1;
  word uTruth0;
  word F;
  word ef;
  word cd;
  word ab;
  word f;
  word e;
  word d;
  word c;
  word b;
  word a;
  Vec_Wrd_t *pVStack_18;
  int RetValue;
  Vec_Wrd_t *vDivTruths;
  Rsb_Man_t *p;
  
  b = s_Truths6[0];
  c = s_Truths6[1];
  d = s_Truths6[2];
  e = s_Truths6[3];
  f = s_Truths6[4];
  ab = s_Truths6[5];
  cd = s_Truths6[0] & s_Truths6[1];
  ef = s_Truths6[2] & s_Truths6[3];
  F = s_Truths6[4] & s_Truths6[5];
  uTruth0 = cd | ef | F;
  pVStack_18 = Vec_WrdAlloc(100);
  Vec_WrdPush(pVStack_18,b);
  Vec_WrdPush(pVStack_18,c);
  Vec_WrdPush(pVStack_18,d);
  Vec_WrdPush(pVStack_18,e);
  Vec_WrdPush(pVStack_18,f);
  Vec_WrdPush(pVStack_18,ab);
  Vec_WrdPush(pVStack_18,cd);
  Vec_WrdPush(pVStack_18,ef);
  Vec_WrdPush(pVStack_18,F);
  vDivTruths = (Vec_Wrd_t *)Rsb_ManAlloc(6,0x40,4,1);
  a._4_4_ = Rsb_ManPerformResub6((Rsb_Man_t *)vDivTruths,6,uTruth0,pVStack_18,&uTruth1,&local_80,1);
  Rsb_ManFree((Rsb_Man_t *)vDivTruths);
  Vec_WrdFree(pVStack_18);
  return;
}

Assistant:

void Rsb_ManPerformResub6Test()
{
    Rsb_Man_t * p;
    Vec_Wrd_t * vDivTruths;
    int RetValue;
    word a = s_Truths6[0];
    word b = s_Truths6[1];
    word c = s_Truths6[2];
    word d = s_Truths6[3];
    word e = s_Truths6[4];
    word f = s_Truths6[5];
    word ab = a & b;
    word cd = c & d;
    word ef = e & f;
    word F = ab | cd | ef;
    word uTruth0, uTruth1;

    vDivTruths = Vec_WrdAlloc( 100 );
    Vec_WrdPush( vDivTruths, a );
    Vec_WrdPush( vDivTruths, b );
    Vec_WrdPush( vDivTruths, c );
    Vec_WrdPush( vDivTruths, d );
    Vec_WrdPush( vDivTruths, e );
    Vec_WrdPush( vDivTruths, f );
    Vec_WrdPush( vDivTruths, ab );
    Vec_WrdPush( vDivTruths, cd );
    Vec_WrdPush( vDivTruths, ef );

    p = Rsb_ManAlloc( 6, 64, 4, 1 );

    RetValue = Rsb_ManPerformResub6( p, 6, F, vDivTruths, &uTruth0, &uTruth1, 1 );

    Rsb_ManFree( p );
    Vec_WrdFree( vDivTruths );
}